

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_relay.cpp
# Opt level: O0

bool __thiscall UDPRelay::Init(UDPRelay *this)

{
  int iVar1;
  char *__cp;
  undefined1 local_28 [8];
  sockaddr_in service;
  UDPRelay *this_local;
  
  service.sin_zero = (uchar  [8])this;
  iVar1 = socket(2,2,0x11);
  this->server_socket_ = iVar1;
  if (this->server_socket_ == -1) {
    this_local._7_1_ = false;
  }
  else {
    local_28._0_2_ = 2;
    __cp = (char *)std::__cxx11::string::c_str();
    inet_pton(2,__cp,local_28 + 4);
    local_28._2_2_ = htons((uint16_t)this->listen_port_);
    iVar1 = bind(this->server_socket_,(sockaddr *)local_28,0x10);
    if (iVar1 == 0) {
      SetNoBlocking(this->server_socket_);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool UDPRelay::Init()
{
    server_socket_ = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
    if (server_socket_ == INVALID_SOCKET)
        return false;
    struct sockaddr_in service;
    service.sin_family = AF_INET;
    inet_pton(AF_INET, listen_addr_.c_str(), &service.sin_addr.s_addr);
    service.sin_port = htons(listen_port_);

    if (0 != bind(server_socket_, (sockaddr *)&service,
                  sizeof(service)))
    {
        return false;
    }
    SetNoBlocking(server_socket_);
    return true;
}